

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

uint __thiscall duckdb::Value::GetValueInternal<unsigned_int>(Value *this)

{
  LogicalTypeId LVar1;
  PhysicalType PVar2;
  uint uVar3;
  string *psVar4;
  NotImplementedException *this_00;
  InternalException *pIVar5;
  uint64_t in_RDX;
  hugeint_t input;
  interval_t input_00;
  uhugeint_t input_01;
  LogicalType local_a0;
  Value local_88;
  string local_48;
  anon_union_16_2_67f50693_for_value local_28;
  
  if (this->is_null == true) {
    pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Calling GetValueInternal on a value that is NULL",
               (allocator *)&local_a0);
    InternalException::InternalException(pIVar5,(string *)&local_88);
    __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  LVar1 = (this->type_).id_;
  switch(LVar1) {
  case BOOLEAN:
    uVar3 = Cast::Operation<bool,unsigned_int>((this->value_).boolean);
    return uVar3;
  case TINYINT:
    uVar3 = Cast::Operation<signed_char,unsigned_int>((this->value_).tinyint);
    return uVar3;
  case SMALLINT:
    uVar3 = Cast::Operation<short,unsigned_int>((this->value_).smallint);
    return uVar3;
  case INTEGER:
    uVar3 = Cast::Operation<int,unsigned_int>((this->value_).integer);
    return uVar3;
  case BIGINT:
    uVar3 = Cast::Operation<long,unsigned_int>((this->value_).bigint);
    return uVar3;
  case DATE:
    uVar3 = Cast::Operation<duckdb::date_t,unsigned_int>((date_t)(this->value_).date.days);
    return uVar3;
  case TIME:
    uVar3 = Cast::Operation<duckdb::dtime_t,unsigned_int>((dtime_t)(this->value_).time.micros);
    return uVar3;
  case TIMESTAMP_SEC:
    uVar3 = Cast::Operation<duckdb::timestamp_sec_t,unsigned_int>
                      ((timestamp_sec_t)(this->value_).timestamp_s.super_timestamp_t.value);
    return uVar3;
  case TIMESTAMP_MS:
    uVar3 = Cast::Operation<duckdb::timestamp_ms_t,unsigned_int>
                      ((timestamp_ms_t)(this->value_).timestamp_ms.super_timestamp_t.value);
    return uVar3;
  case TIMESTAMP:
    uVar3 = Cast::Operation<duckdb::timestamp_t,unsigned_int>
                      ((timestamp_t)(this->value_).timestamp.value);
    return uVar3;
  case TIMESTAMP_NS:
    uVar3 = Cast::Operation<duckdb::timestamp_ns_t,unsigned_int>
                      ((timestamp_ns_t)(this->value_).timestamp_ns.super_timestamp_t.value);
    return uVar3;
  case DECIMAL:
    LogicalType::LogicalType(&local_a0,DOUBLE);
    DefaultCastAs(&local_88,this,&local_a0,false);
    uVar3 = GetValueInternal<unsigned_int>(&local_88);
    ~Value(&local_88);
    LogicalType::~LogicalType(&local_a0);
    break;
  case FLOAT:
    uVar3 = Cast::Operation<float,unsigned_int>((this->value_).float_);
    return uVar3;
  case DOUBLE:
    uVar3 = Cast::Operation<double,unsigned_int>((this->value_).double_);
    return uVar3;
  case VARCHAR:
    psVar4 = StringValue::Get_abi_cxx11_(this);
    string_t::string_t((string_t *)&local_28.pointer,(psVar4->_M_dataplus)._M_p);
    uVar3 = Cast::Operation<duckdb::string_t,unsigned_int>((string_t)local_28);
    break;
  case INTERVAL:
    input_00.micros = in_RDX;
    input_00._0_8_ = (this->value_).hugeint.upper;
    uVar3 = Cast::Operation<duckdb::interval_t,unsigned_int>((Cast *)(this->value_).bigint,input_00)
    ;
    return uVar3;
  case UTINYINT:
switchD_012c4fab_caseD_1c:
    uVar3 = Cast::Operation<unsigned_char,unsigned_int>((this->value_).utinyint);
    return uVar3;
  case USMALLINT:
switchD_012c4fab_caseD_1d:
    uVar3 = Cast::Operation<unsigned_short,unsigned_int>((this->value_).usmallint);
    return uVar3;
  case UINTEGER:
switchD_012c4fab_caseD_1e:
    uVar3 = Cast::Operation<unsigned_int,unsigned_int>((this->value_).uinteger);
    return uVar3;
  case UBIGINT:
    uVar3 = Cast::Operation<unsigned_long,unsigned_int>((this->value_).ubigint);
    return uVar3;
  case TIMESTAMP_TZ:
    uVar3 = Cast::Operation<duckdb::timestamp_tz_t,unsigned_int>
                      ((timestamp_tz_t)(this->value_).timestamp_tz.super_timestamp_t.value);
    return uVar3;
  case TIME_TZ:
    uVar3 = Cast::Operation<duckdb::dtime_tz_t,unsigned_int>((dtime_tz_t)(this->value_).timetz.bits)
    ;
    return uVar3;
  case UHUGEINT:
    input_01.upper = in_RDX;
    input_01.lower = (this->value_).hugeint.upper;
    uVar3 = Cast::Operation<duckdb::uhugeint_t,unsigned_int>((Cast *)(this->value_).bigint,input_01)
    ;
    return uVar3;
  case HUGEINT:
  case UUID:
    input.upper = in_RDX;
    input.lower = (this->value_).hugeint.upper;
    uVar3 = Cast::Operation<duckdb::hugeint_t,unsigned_int>((Cast *)(this->value_).bigint,input);
    return uVar3;
  default:
    if (LVar1 == ENUM) {
      PVar2 = (this->type_).physical_type_;
      if (PVar2 == UINT32) goto switchD_012c4fab_caseD_1e;
      if (PVar2 == UINT16) goto switchD_012c4fab_caseD_1d;
      if (PVar2 != UINT8) {
        pIVar5 = (InternalException *)__cxa_allocate_exception(0x10);
        ::std::__cxx11::string::string
                  ((string *)&local_88,"Invalid Internal Type for ENUMs",(allocator *)&local_a0);
        InternalException::InternalException(pIVar5,(string *)&local_88);
        __cxa_throw(pIVar5,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto switchD_012c4fab_caseD_1c;
    }
  case CHAR:
  case BLOB:
  case TIMESTAMP_TZ|SQLNULL:
  case TIME_TZ|SQLNULL:
  case BIT:
  case STRING_LITERAL:
  case INTEGER_LITERAL:
  case VARINT:
  case 0x28:
  case 0x29:
  case TIMESTAMP_TZ|BOOLEAN:
  case TIMESTAMP_TZ|TINYINT:
  case TIMESTAMP_TZ|SMALLINT:
  case TIMESTAMP_TZ|INTEGER:
  case TIMESTAMP_TZ|BIGINT:
  case TIMESTAMP_TZ|DATE:
  case TIMESTAMP_TZ|TIME:
  case POINTER:
  case TIMESTAMP_TZ|TIMESTAMP_NS:
  case VALIDITY:
    this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_88,"Unimplemented type \"%s\" for GetValue()",(allocator *)&local_a0
              );
    LogicalType::ToString_abi_cxx11_(&local_48,&this->type_);
    NotImplementedException::NotImplementedException<std::__cxx11::string>
              (this_00,(string *)&local_88,&local_48);
    __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return uVar3;
}

Assistant:

T Value::GetValueInternal() const {
	if (IsNull()) {
		throw InternalException("Calling GetValueInternal on a value that is NULL");
	}
	switch (type_.id()) {
	case LogicalTypeId::BOOLEAN:
		return Cast::Operation<bool, T>(value_.boolean);
	case LogicalTypeId::TINYINT:
		return Cast::Operation<int8_t, T>(value_.tinyint);
	case LogicalTypeId::SMALLINT:
		return Cast::Operation<int16_t, T>(value_.smallint);
	case LogicalTypeId::INTEGER:
		return Cast::Operation<int32_t, T>(value_.integer);
	case LogicalTypeId::BIGINT:
		return Cast::Operation<int64_t, T>(value_.bigint);
	case LogicalTypeId::HUGEINT:
	case LogicalTypeId::UUID:
		return Cast::Operation<hugeint_t, T>(value_.hugeint);
	case LogicalTypeId::UHUGEINT:
		return Cast::Operation<uhugeint_t, T>(value_.uhugeint);
	case LogicalTypeId::DATE:
		return Cast::Operation<date_t, T>(value_.date);
	case LogicalTypeId::TIME:
		return Cast::Operation<dtime_t, T>(value_.time);
	case LogicalTypeId::TIME_TZ:
		return Cast::Operation<dtime_tz_t, T>(value_.timetz);
	case LogicalTypeId::TIMESTAMP:
		return Cast::Operation<timestamp_t, T>(value_.timestamp);
	case LogicalTypeId::TIMESTAMP_SEC:
		return Cast::Operation<timestamp_sec_t, T>(value_.timestamp_s);
	case LogicalTypeId::TIMESTAMP_MS:
		return Cast::Operation<timestamp_ms_t, T>(value_.timestamp_ms);
	case LogicalTypeId::TIMESTAMP_NS:
		return Cast::Operation<timestamp_ns_t, T>(value_.timestamp_ns);
	case LogicalTypeId::TIMESTAMP_TZ:
		return Cast::Operation<timestamp_tz_t, T>(value_.timestamp_tz);
	case LogicalTypeId::UTINYINT:
		return Cast::Operation<uint8_t, T>(value_.utinyint);
	case LogicalTypeId::USMALLINT:
		return Cast::Operation<uint16_t, T>(value_.usmallint);
	case LogicalTypeId::UINTEGER:
		return Cast::Operation<uint32_t, T>(value_.uinteger);
	case LogicalTypeId::UBIGINT:
		return Cast::Operation<uint64_t, T>(value_.ubigint);
	case LogicalTypeId::FLOAT:
		return Cast::Operation<float, T>(value_.float_);
	case LogicalTypeId::DOUBLE:
		return Cast::Operation<double, T>(value_.double_);
	case LogicalTypeId::VARCHAR:
		return Cast::Operation<string_t, T>(StringValue::Get(*this).c_str());
	case LogicalTypeId::INTERVAL:
		return Cast::Operation<interval_t, T>(value_.interval);
	case LogicalTypeId::DECIMAL:
		return DefaultCastAs(LogicalType::DOUBLE).GetValueInternal<T>();
	case LogicalTypeId::ENUM: {
		switch (type_.InternalType()) {
		case PhysicalType::UINT8:
			return Cast::Operation<uint8_t, T>(value_.utinyint);
		case PhysicalType::UINT16:
			return Cast::Operation<uint16_t, T>(value_.usmallint);
		case PhysicalType::UINT32:
			return Cast::Operation<uint32_t, T>(value_.uinteger);
		default:
			throw InternalException("Invalid Internal Type for ENUMs");
		}
	}
	default:
		throw NotImplementedException("Unimplemented type \"%s\" for GetValue()", type_.ToString());
	}
}